

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O2

_Bool art_internal_validate_at(art_node_t *node,art_internal_validate_t validator)

{
  long lVar1;
  art_node_t aVar2;
  art_internal_validate_t validator_00;
  art_internal_validate_t validator_01;
  art_internal_validate_t validator_02;
  art_internal_validate_t validator_03;
  art_validate_cb_t p_Var3;
  _Bool _Var4;
  int iVar5;
  char **ppcVar6;
  ulong uVar7;
  long lVar8;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  int i;
  long lVar13;
  art_node_t *paVar14;
  undefined8 local_38;
  art_key_chunk_t aStack_30;
  art_key_chunk_t aStack_2f;
  undefined6 uStack_2e;
  
  iVar5 = validator.depth;
  ppcVar6 = validator.reason;
  if (node == (art_node_t *)0x0) {
    pcVar9 = "node is null";
  }
  else if (((ulong)node & 1) == 0) {
    aVar2 = node[1];
    if ((int)(validator.depth + (uint)(byte)aVar2) < 6) {
      memcpy(validator.current_key + validator.depth,node + 2,(ulong)(byte)aVar2);
      p_Var3 = validator.validate_cb;
      ppcVar6 = validator.reason;
      validator.depth = validator.depth + (uint)(byte)aVar2;
      switch(*node) {
      case (art_node_t)0x0:
        aStack_30 = validator.current_key[4];
        aStack_2f = validator.current_key[5];
        uStack_2e = validator._26_6_;
        aVar2 = node[7];
        if (aVar2 == (art_node_t)0x0) {
          pcVar9 = "Node4 has no children";
        }
        else if ((byte)aVar2 < 5) {
          if (aVar2 == (art_node_t)0x1) {
            pcVar9 = "Node4 and child node should have been combined";
          }
          else {
            local_38 = CONCAT44(validator.current_key._0_4_,validator.depth + 1);
            uVar7 = 1;
            uVar11 = 0;
            while( true ) {
              if ((byte)node[7] <= uVar11) {
                return true;
              }
              if ((uVar11 != 0) && ((byte)node[uVar11 + 8] <= (byte)node[uVar11 + 7])) break;
              uVar10 = uVar7;
              while (uVar10 < (byte)node[7]) {
                lVar13 = uVar10 * 8;
                uVar10 = uVar10 + 1;
                if (*(long *)(node + uVar11 * 8 + 0x10) == *(long *)(node + lVar13 + 0x10)) {
                  pcVar9 = "Node4 has duplicate children";
                  goto LAB_001064fe;
                }
              }
              *(art_node_t *)((long)&local_38 + (long)(int)local_38 + 3) = node[uVar11 + 8];
              validator_02.validate_cb = p_Var3;
              validator_02.reason = ppcVar6;
              validator_02.depth = (int)local_38;
              validator_02.current_key[0] = local_38._4_1_;
              validator_02.current_key[1] = local_38._5_1_;
              validator_02.current_key[2] = local_38._6_1_;
              validator_02.current_key[3] = local_38._7_1_;
              validator_02.current_key[4] = aStack_30;
              validator_02.current_key[5] = aStack_2f;
              validator_02._26_6_ = uStack_2e;
              _Var4 = art_internal_validate_at
                                (*(art_node_t **)(node + uVar11 * 8 + 0x10),validator_02);
              uVar7 = uVar7 + 1;
              uVar11 = uVar11 + 1;
              if (!_Var4) {
                return false;
              }
            }
            pcVar9 = "Node4 keys are not strictly increasing";
          }
        }
        else {
          pcVar9 = "Node4 has too many children";
        }
        break;
      case (art_node_t)0x1:
        aStack_30 = validator.current_key[4];
        aStack_2f = validator.current_key[5];
        uStack_2e = validator._26_6_;
        if ((byte)node[7] < 5) {
          pcVar9 = "Node16 has too few children";
        }
        else if ((byte)node[7] < 0x11) {
          local_38 = CONCAT44(validator.current_key._0_4_,validator.depth + 1);
          paVar14 = node + 0x20;
          lVar13 = 1;
          uVar7 = 0;
          while( true ) {
            if ((byte)node[7] <= uVar7) {
              return true;
            }
            if ((uVar7 != 0) && ((byte)node[uVar7 + 8] <= (byte)node[uVar7 + 7])) break;
            lVar8 = 0;
            while ((ulong)(lVar13 + lVar8) < (ulong)(byte)node[7]) {
              lVar1 = lVar8 * 8;
              lVar8 = lVar8 + 1;
              if (*(long *)(node + uVar7 * 8 + 0x18) == *(long *)(paVar14 + lVar1)) {
                pcVar9 = "Node16 has duplicate children";
                goto LAB_001064fe;
              }
            }
            *(art_node_t *)((long)&local_38 + (long)(int)local_38 + 3) = node[uVar7 + 8];
            validator_01.validate_cb = p_Var3;
            validator_01.reason = ppcVar6;
            validator_01.depth = (int)local_38;
            validator_01.current_key[0] = local_38._4_1_;
            validator_01.current_key[1] = local_38._5_1_;
            validator_01.current_key[2] = local_38._6_1_;
            validator_01.current_key[3] = local_38._7_1_;
            validator_01.current_key[4] = aStack_30;
            validator_01.current_key[5] = aStack_2f;
            validator_01._26_6_ = uStack_2e;
            _Var4 = art_internal_validate_at(*(art_node_t **)(node + uVar7 * 8 + 0x18),validator_01)
            ;
            lVar13 = lVar13 + 1;
            paVar14 = paVar14 + 8;
            uVar7 = uVar7 + 1;
            if (!_Var4) {
              return false;
            }
          }
          pcVar9 = "Node16 keys are not strictly increasing";
        }
        else {
          pcVar9 = "Node16 has too many children";
        }
        break;
      case (art_node_t)0x2:
        aStack_30 = validator.current_key[4];
        aStack_2f = validator.current_key[5];
        uStack_2e = validator._26_6_;
        if ((byte)node[7] < 0x11) {
          pcVar9 = "Node48 has too few children";
        }
        else if ((byte)node[7] < 0x31) {
          uVar7 = 0;
          for (lVar13 = 0; lVar13 != 0x100; lVar13 = lVar13 + 1) {
            uVar11 = (ulong)(byte)node[lVar13 + 0x10];
            if (uVar11 != 0x30) {
              if ((uVar7 >> (uVar11 & 0x3f) & 1) != 0) {
                pcVar9 = "Node48 keys point to the same child index";
                goto LAB_001064fe;
              }
              if (*(long *)(node + uVar11 * 8 + 0x110) == 0) {
                pcVar9 = "Node48 has a NULL child";
                goto LAB_001064fe;
              }
              uVar7 = uVar7 | 1L << ((byte)node[lVar13 + 0x10] & 0x3f);
            }
          }
          if ((*(ulong *)(node + 8) ^ uVar7) == 0xffffffffffff) {
            do {
              if (uVar7 == 0) {
                local_38 = CONCAT44(validator.current_key._0_4_,validator.depth + 1);
                lVar13 = 0;
                do {
                  if (lVar13 == 0x100) {
                    return true;
                  }
                  aVar2 = node[lVar13 + 0x10];
                  if ((ulong)(byte)aVar2 != 0x30) {
                    *(char *)((long)&local_38 + (long)(int)local_38 + 3) = (char)lVar13;
                    validator_03.validate_cb = p_Var3;
                    validator_03.reason = ppcVar6;
                    validator_03.depth = (int)local_38;
                    validator_03.current_key[0] = local_38._4_1_;
                    validator_03.current_key[1] = local_38._5_1_;
                    validator_03.current_key[2] = local_38._6_1_;
                    validator_03.current_key[3] = local_38._7_1_;
                    validator_03.current_key[4] = aStack_30;
                    validator_03.current_key[5] = aStack_2f;
                    validator_03._26_6_ = uStack_2e;
                    _Var4 = art_internal_validate_at
                                      (*(art_node_t **)(node + (ulong)(byte)aVar2 * 8 + 0x110),
                                       validator_03);
                    if (!_Var4) {
                      return false;
                    }
                  }
                  lVar13 = lVar13 + 1;
                } while( true );
              }
              lVar13 = 0;
              if (uVar7 != 0) {
                for (; (uVar7 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
                }
              }
              uVar7 = uVar7 & uVar7 - 1;
              for (uVar11 = uVar7; uVar11 != 0; uVar11 = uVar11 & uVar11 - 1) {
                lVar8 = 0;
                if (uVar11 != 0) {
                  for (; (uVar11 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
                  }
                }
                if (*(long *)(node + lVar13 * 8 + 0x110) == *(long *)(node + lVar8 * 8 + 0x110)) {
                  pcVar9 = "Node48 has duplicate children";
                  goto LAB_001064fe;
                }
              }
            } while( true );
          }
          pcVar9 = "Node48 available_children does not match actual children";
        }
        else {
          pcVar9 = "Node48 has too many children";
        }
        break;
      case (art_node_t)0x3:
        aStack_30 = validator.current_key[4];
        aStack_2f = validator.current_key[5];
        uStack_2e = validator._26_6_;
        if (*(ushort *)(node + 8) < 0x31) {
          pcVar9 = "Node256 has too few children";
        }
        else if (*(ushort *)(node + 8) < 0x101) {
          local_38 = CONCAT44(validator.current_key._0_4_,validator.depth + 1);
          uVar12 = 0;
          for (lVar13 = 0; lVar13 != 0x100; lVar13 = lVar13 + 1) {
            paVar14 = *(art_node_t **)(node + lVar13 * 8 + 0x10);
            if (paVar14 != (art_node_t *)0x0) {
              uVar12 = uVar12 + 1;
              lVar8 = lVar13;
              while (lVar8 != 0xff) {
                lVar1 = lVar8 * 8;
                lVar8 = lVar8 + 1;
                if (paVar14 == *(art_node_t **)(node + lVar1 + 0x18)) {
                  pcVar9 = "Node256 has duplicate children";
                  goto LAB_001064fe;
                }
              }
              *(char *)((long)&local_38 + (long)(int)local_38 + 3) = (char)lVar13;
              validator_00.validate_cb = p_Var3;
              validator_00.reason = ppcVar6;
              validator_00.depth = (int)local_38;
              validator_00.current_key[0] = local_38._4_1_;
              validator_00.current_key[1] = local_38._5_1_;
              validator_00.current_key[2] = local_38._6_1_;
              validator_00.current_key[3] = local_38._7_1_;
              validator_00.current_key[4] = aStack_30;
              validator_00.current_key[5] = aStack_2f;
              validator_00._26_6_ = uStack_2e;
              _Var4 = art_internal_validate_at(paVar14,validator_00);
              if (!_Var4) {
                return false;
              }
            }
          }
          if (uVar12 == *(ushort *)(node + 8)) {
            return true;
          }
          pcVar9 = "Node256 count does not match actual children";
        }
        else {
          pcVar9 = "Node256 has too many children";
        }
        break;
      default:
        pcVar9 = "invalid node type";
      }
    }
    else {
      pcVar9 = "node has too much prefix at given depth";
    }
  }
  else {
    uVar7 = (ulong)(byte)validator.depth;
    validator.depth = iVar5;
    iVar5 = bcmp((art_val_t *)((ulong)node & 0xfffffffffffffffe),validator.current_key,uVar7);
    ppcVar6 = validator.reason;
    if (iVar5 == 0) {
      if (validator.validate_cb == (art_validate_cb_t)0x0) {
        return true;
      }
      _Var4 = (*validator.validate_cb)
                        ((art_val_t *)((ulong)node & 0xfffffffffffffffe),validator.reason);
      if (!_Var4) {
        if (*ppcVar6 != (char *)0x0) {
          return false;
        }
        *ppcVar6 = "leaf validation failed";
        return false;
      }
      return true;
    }
    pcVar9 = "leaf key does not match its position\'s prefix in the tree";
  }
LAB_001064fe:
  *ppcVar6 = pcVar9;
  return false;
}

Assistant:

static bool art_internal_validate_at(const art_node_t *node,
                                     art_internal_validate_t validator) {
    if (node == NULL) {
        return art_validate_fail(&validator, "node is null");
    }
    if (art_is_leaf(node)) {
        art_leaf_t *leaf = CAST_LEAF(node);
        if (art_compare_prefix(leaf->key, 0, validator.current_key, 0,
                               validator.depth) != 0) {
            return art_validate_fail(
                &validator,
                "leaf key does not match its position's prefix in the tree");
        }
        if (validator.validate_cb != NULL &&
            !validator.validate_cb(leaf, validator.reason)) {
            if (*validator.reason == NULL) {
                *validator.reason = "leaf validation failed";
            }
            return false;
        }
    } else {
        art_inner_node_t *inner_node = (art_inner_node_t *)node;

        if (validator.depth + inner_node->prefix_size + 1 > ART_KEY_BYTES) {
            return art_validate_fail(&validator,
                                     "node has too much prefix at given depth");
        }
        memcpy(validator.current_key + validator.depth, inner_node->prefix,
               inner_node->prefix_size);
        validator.depth += inner_node->prefix_size;

        switch (inner_node->typecode) {
            case ART_NODE4_TYPE:
                if (!art_node4_internal_validate((art_node4_t *)inner_node,
                                                 validator)) {
                    return false;
                }
                break;
            case ART_NODE16_TYPE:
                if (!art_node16_internal_validate((art_node16_t *)inner_node,
                                                  validator)) {
                    return false;
                }
                break;
            case ART_NODE48_TYPE:
                if (!art_node48_internal_validate((art_node48_t *)inner_node,
                                                  validator)) {
                    return false;
                }
                break;
            case ART_NODE256_TYPE:
                if (!art_node256_internal_validate((art_node256_t *)inner_node,
                                                   validator)) {
                    return false;
                }
                break;
            default:
                return art_validate_fail(&validator, "invalid node type");
        }
    }
    return true;
}